

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O0

exr_result_t exr_attr_list_destroy(exr_context_t ctxt,exr_attribute_list_t *list)

{
  int *in_RSI;
  long in_RDI;
  int i;
  exr_result_t rv;
  exr_result_t arv;
  exr_attribute_list_t nil;
  int local_3c;
  exr_result_t in_stack_ffffffffffffffcc;
  exr_context_t in_stack_ffffffffffffffd0;
  undefined8 local_28;
  undefined8 local_20;
  exr_result_t local_4;
  
  memset(&stack0xffffffffffffffd0,0,0x18);
  local_4 = 0;
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else if (in_RSI != (int *)0x0) {
    if (*(long *)(in_RSI + 2) != 0) {
      for (local_3c = 0; local_3c < *in_RSI; local_3c = local_3c + 1) {
        in_stack_ffffffffffffffcc =
             attr_destroy(in_stack_ffffffffffffffd0,
                          (exr_attribute_t *)CONCAT44(in_stack_ffffffffffffffcc,local_4));
        if (in_stack_ffffffffffffffcc != 0) {
          local_4 = in_stack_ffffffffffffffcc;
        }
      }
      (**(code **)(in_RDI + 0x60))(*(undefined8 *)(in_RSI + 2));
    }
    *(exr_context_t *)in_RSI = in_stack_ffffffffffffffd0;
    *(undefined8 *)(in_RSI + 2) = local_28;
    *(undefined8 *)(in_RSI + 4) = local_20;
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_list_destroy (exr_context_t ctxt, exr_attribute_list_t* list)
{
    exr_attribute_list_t nil = {0};
    exr_result_t         arv;
    exr_result_t         rv = EXR_ERR_SUCCESS;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (list)
    {
        if (list->entries)
        {
            for (int i = 0; i < list->num_attributes; ++i)
            {
                arv = attr_destroy (ctxt, list->entries[i]);
                if (arv != EXR_ERR_SUCCESS) rv = arv;
            }
            ctxt->free_fn (list->entries);
        }
        *list = nil;
    }
    return rv;
}